

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  char cVar1;
  GCtab *t_00;
  short sVar2;
  BCReg func_00;
  TRef TVar3;
  int iVar4;
  TRef TVar5;
  TRef *pTVar6;
  TValue *pTVar7;
  cTValue *pcVar8;
  code *cont;
  bool bVar9;
  bool bVar10;
  cTValue *local_2d8;
  TRef fref;
  IRType t_1;
  TRef mtref;
  TRef key;
  cTValue *mo;
  int hasmm;
  int keybarrier;
  GCtab *mt;
  TRef res;
  IRType t;
  TRef tr;
  cTValue *val;
  TValue *tv;
  TRef *base;
  BCReg func;
  cTValue *oldv;
  uint local_268;
  int iStack_264;
  IRType1 rbguard;
  IRRef rbref;
  IROp loadop;
  IROp xrefop;
  TRef xref;
  RecordIndex *ix_local;
  jit_State *J_local;
  ushort local_144;
  uint local_134;
  
  do {
    if ((ix->tab & 0x1f000000) == 0xb000000) {
      if (((ix->keyv).u64 == 0xffffffffffffffff) ||
         (((uint)((int)(ix->keyv).field_4.it >> 0xf) < 0xfffffff2 &&
          (((ix->keyv).n != (ix->keyv).n || (NAN((ix->keyv).n) || NAN((ix->keyv).n))))))) {
        if (ix->val != 0) {
          lj_trace_err(J,LJ_TRERR_STORENN);
        }
        if ((ix->key & 0xffff) < 0x8000) {
          if ((ix->idxchain == 0) || (iVar4 = lj_record_mm_lookup(J,ix,MM_index), iVar4 == 0)) {
            return 0x7fff;
          }
          goto LAB_0015479d;
        }
      }
      TVar3 = rec_idx_key(J,ix,&local_268,(IRType1 *)((long)&oldv + 7));
      loadop._0_2_ = (undefined2)TVar3;
      cVar1 = *(char *)((long)(J->cur).ir + (ulong)(TVar3 & 0xffff) * 8 + 5);
      iStack_264 = 0x43;
      if (cVar1 == '8') {
        iStack_264 = 0x42;
      }
      if (cVar1 == '\x1a') {
        local_2d8 = *(cTValue **)&(J->cur).ir[(ulong)(TVar3 & 0xffff) + 1].i;
      }
      else {
        local_2d8 = ix->oldv;
      }
      if (ix->val == 0) {
        if ((uint)((int)(local_2d8->field_4).it >> 0xf) < 0xfffffff2) {
          local_134 = 0xe;
        }
        else {
          local_134 = (int)(local_2d8->field_4).it >> 0xf ^ 0xffffffff;
        }
        if (local_2d8 == (cTValue *)(J[-1].penalty + 0x34)) {
          TVar3 = lj_ir_kptr_(J,IR_KKPTR,J[-1].penalty + 0x34);
          (J->fold).ins.field_0.ot = 0x889;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
          lj_opt_fold(J);
          mt._4_4_ = 0x7fff;
        }
        else {
          (J->fold).ins.field_0.ot = (ushort)(iStack_264 << 8) | (ushort)local_134 | 0x80;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = 0;
          mt._4_4_ = lj_opt_fold(J);
        }
        if ((mt._4_4_ & 0xffff) < local_268) {
          lj_ir_rollback(J,local_268);
          (J->guardemit).irt = oldv._7_1_;
        }
        if (((local_134 != 0) || (ix->idxchain == 0)) ||
           (iVar4 = lj_record_mm_lookup(J,ix,MM_index), iVar4 == 0)) {
          if (local_134 < 3) {
            mt._4_4_ = local_134 * 0xffffff + 0x7fff;
          }
          return mt._4_4_;
        }
      }
      else {
        t_00 = *(GCtab **)(((ix->tabv).u64 & 0x7fffffffffff) + 0x20);
        bVar9 = false;
        if ((ix->key >> 0x18 & 0x1f) - 4 < 9) {
          bVar9 = (ix->val & 0x1f000000) != 0;
        }
        if ((TVar3 & 0xffff) < local_268) {
          lj_ir_rollback(J,local_268);
          (J->guardemit).irt = oldv._7_1_;
        }
        if (local_2d8->u64 != 0xffffffffffffffff) {
          iVar4 = lj_opt_fwd_wasnonnil(J,(IROpT)iStack_264,TVar3 & 0xffff);
          if (iVar4 == 0) {
            if (cVar1 == ':') {
              TVar3 = lj_ir_kptr_(J,IR_KKPTR,J[-1].penalty + 0x34);
              (J->fold).ins.field_0.ot = 0x989;
              (J->fold).ins.field_0.op1 = (undefined2)loadop;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
              lj_opt_fold(J);
            }
            if (ix->idxchain != 0) {
              if (t_00 == (GCtab *)0x0) {
                TVar3 = ix->tab;
                (J->fold).ins.field_0.ot = 0x450b;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
                (J->fold).ins.field_0.op2 = 7;
                TVar3 = lj_opt_fold(J);
                TVar5 = lj_ir_knull(J,IRT_TAB);
                (J->fold).ins.field_0.ot = 0x88b;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
                lj_opt_fold(J);
              }
              else {
                if ((uint)((int)(local_2d8->field_4).it >> 0xf) < 0xfffffff2) {
                  local_144 = 0xe;
                }
                else {
                  local_144 = (ushort)((int)(local_2d8->field_4).it >> 0xf) ^ 0xffff;
                }
                (J->fold).ins.field_0.ot = (ushort)(iStack_264 << 8) | local_144 | 0x80;
                (J->fold).ins.field_0.op1 = (undefined2)loadop;
                (J->fold).ins.field_0.op2 = 0;
                lj_opt_fold(J);
              }
            }
          }
          else {
            bVar9 = false;
          }
LAB_00155824:
          if ((ix->val >> 0x18 & 0x1f) - 0xf < 5) {
            TVar3 = ix->val;
            (J->fold).ins.field_0.ot = 0x5b0e;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
            (J->fold).ins.field_0.op2 = 0x1d3;
            TVar3 = lj_opt_fold(J);
            ix->val = TVar3;
          }
          TVar3 = ix->val;
          (J->fold).ins.field_0.ot =
               ((short)iStack_264 + 8) * 0x100 | (byte)(ix->val >> 0x18) & 0x1f;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
          lj_opt_fold(J);
          if ((bVar9) || ((ix->val >> 0x18 & 0x1f) - 4 < 9)) {
            TVar3 = ix->tab;
            (J->fold).ins.field_0.ot = 0x5800;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
            (J->fold).ins.field_0.op2 = 0;
            lj_opt_fold(J);
          }
          iVar4 = nommstr(J,ix->key);
          if (iVar4 == 0) {
            TVar3 = ix->tab;
            (J->fold).ins.field_0.ot = 0x3e09;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
            (J->fold).ins.field_0.op2 = 0xc;
            TVar3 = lj_opt_fold(J);
            TVar5 = lj_ir_kint(J,0);
            (J->fold).ins.field_0.ot = 0x4d10;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
            lj_opt_fold(J);
          }
          J->needsnap = '\x01';
          return 0;
        }
        bVar10 = false;
        if ((ix->idxchain != 0) && (t_00 != (GCtab *)0x0)) {
          pcVar8 = lj_tab_getstr(t_00,*(GCstr **)&J[-1].penalty[0x3f].val);
          bVar10 = false;
          if (pcVar8 != (cTValue *)0x0) {
            bVar10 = pcVar8->u64 != 0xffffffffffffffff;
          }
        }
        if (bVar10) {
          (J->fold).ins.field_0.ot = (ushort)(iStack_264 << 8) | 0x80;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = 0;
          lj_opt_fold(J);
        }
        else if (cVar1 == ':') {
          sVar2 = 9;
          if (local_2d8 == (cTValue *)(J[-1].penalty + 0x34)) {
            sVar2 = 8;
          }
          TVar3 = lj_ir_kptr_(J,IR_KKPTR,J[-1].penalty + 0x34);
          (J->fold).ins.field_0.ot = sVar2 << 8 | 0x89;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
          lj_opt_fold(J);
        }
        if ((ix->idxchain == 0) || (iVar4 = lj_record_mm_lookup(J,ix,MM_newindex), iVar4 == 0)) {
          if (local_2d8 == (cTValue *)(J[-1].penalty + 0x34)) {
            t_1 = ix->key;
            if ((t_1 >> 0x18 & 0x1f) - 0xf < 5) {
              (J->fold).ins.field_0.ot = 0x5b0e;
              (J->fold).ins.field_0.op1 = (IRRef1)t_1;
              (J->fold).ins.field_0.op2 = 0x1d3;
              t_1 = lj_opt_fold(J);
            }
            TVar3 = ix->tab;
            (J->fold).ins.field_0.ot = 0x3b09;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
            (J->fold).ins.field_0.op2 = (IRRef1)t_1;
            TVar3 = lj_opt_fold(J);
            loadop._0_2_ = (undefined2)TVar3;
            bVar9 = false;
          }
          goto LAB_00155824;
        }
      }
    }
    else {
      iVar4 = lj_record_mm_lookup(J,ix,(uint)(ix->val != 0));
      if (iVar4 == 0) {
        lj_trace_err(J,LJ_TRERR_NOMM);
      }
    }
LAB_0015479d:
    if ((ix->mobj & 0x1f000000) == 0x8000000) {
      cont = lj_cont_ra;
      if (ix->val != 0) {
        cont = lj_cont_nop;
      }
      func_00 = rec_mm_prep(J,cont);
      pTVar6 = J->base + func_00;
      pTVar7 = J->L->base + func_00;
      *pTVar6 = ix->mobj;
      pTVar6[2] = ix->tab;
      pTVar6[3] = ix->key;
      pTVar7->u64 = (ix->mobjv).u64 & 0x7fffffffffff | 0xfffb800000000000;
      pTVar7[2].gcr.gcptr64 = (uint64_t)ix->tabv;
      pTVar7[3] = ix->keyv;
      if (ix->val == 0) {
        lj_record_call(J,func_00,2);
      }
      else {
        pTVar6[4] = ix->val;
        pTVar7[4] = ix->valv;
        lj_record_call(J,func_00,3);
      }
      return 0;
    }
    if (((((ix->mt == 0x7fff) && (ix->val == 0)) &&
         (((ix->tab & 0x1f000000) == 0xc000000 &&
          ((*(char *)(((ix->tabv).u64 & 0x7fffffffffff) + 10) == '\x03' &&
           ((ix->mobj & 0x1f000000) == 0xb000000)))))) && ((ix->key & 0x1f000000) == 0x4000000)) &&
       ((ix->key & 0xffff) < 0x8000)) {
      pcVar8 = lj_tab_getstr((GCtab *)((ix->mobjv).u64 & 0x7fffffffffff),
                             (GCstr *)((ix->keyv).u64 & 0x7fffffffffff));
      TVar3 = lj_record_constify(J,pcVar8);
      if (TVar3 != 0) {
        return TVar3;
      }
    }
    ix->tab = ix->mobj;
    ix->tabv = ix->mobjv;
    iVar4 = ix->idxchain + -1;
    ix->idxchain = iVar4;
    if (iVar4 == 0) {
      lj_trace_err(J,LJ_TRERR_IDXLOOP);
    }
  } while( true );
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  IRRef rbref;
  IRType1 rbguard;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lj_assertJ(ix->idxchain != 0, "bad usage");
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func + LJ_FR2;
      TValue *tv = J->L->base + func + LJ_FR2;
      base[-LJ_FR2] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv-LJ_FR2, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
#if LJ_HASBUFFER
    /* The index table of buffer objects is treated as immutable. */
    if (ix->mt == TREF_NIL && !ix->val &&
	tref_isudata(ix->tab) && udataV(&ix->tabv)->udtype == UDTYPE_BUFFER &&
	tref_istab(ix->mobj) && tref_isstr(ix->key) && tref_isk(ix->key)) {
      cTValue *val = lj_tab_getstr(tabV(&ix->mobjv), strV(&ix->keyv));
      TRef tr = lj_record_constify(J, val);
      if (tr) return tr;  /* Specialize to the value, i.e. a method. */
    }
#endif
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix, &rbref, &rbguard);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (tref_ref(res) < rbref) {  /* HREFK + load forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tref_ref(xref) < rbref) {  /* HREFK forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_PGC),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lj_assertJ(hasmm, "inconsistent metamethod handling");
	goto handlemm;
      }
      lj_assertJ(!hasmm, "inconsistent metamethod handling");
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key))  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	xref = emitir(IRT(IR_NEWREF, IRT_PGC), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
#ifdef LUAJIT_ENABLE_TABLE_BUMP
	if ((J->flags & JIT_F_OPT_SINK))  /* Avoid a separate flag. */
	  rec_idx_bump(J, ix);
#endif
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_PGC), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}